

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::BoolLiteral::BoolLiteral
          (BoolLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  VariableType *pVVar4;
  Random *this_00;
  bool *pbVar5;
  ConstStridedValueAccess<64> CVar6;
  int local_dc;
  undefined1 auStack_d8 [4];
  int ndx;
  ExecValueAccess access;
  undefined1 auStack_c0 [7];
  bool value;
  Scalar *local_b8;
  ConstStridedValueAccess<1> local_b0;
  ConstValueAccess local_a0;
  ConstStridedValueAccess<1> local_90;
  VariableType local_80;
  uint local_2c;
  uint local_28;
  int maxVal;
  int minVal;
  GeneratorState *local_18;
  GeneratorState *state_local;
  BoolLiteral *this_local;
  
  local_18 = state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BoolLiteral_00cbe2e0;
  pVVar4 = VariableType::getScalarType(TYPE_BOOL);
  ValueStorage<64>::ValueStorage(&this->m_value,pVVar4);
  local_28 = 0;
  local_2c = 1;
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  VariableType::VariableType(&local_80,TYPE_BOOL,1);
  bVar2 = VariableType::operator==(pVVar4,&local_80);
  VariableType::~VariableType(&local_80);
  if (bVar2) {
    local_a0 = ConstValueRangeAccess::getMin(&valueRange);
    local_90 = ConstStridedValueAccess<1>::component(&local_a0,0);
    bVar2 = ConstStridedValueAccess<1>::asBool(&local_90);
    local_28 = (uint)bVar2;
    _auStack_c0 = ConstValueRangeAccess::getMax(&valueRange);
    local_b0 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)auStack_c0,0);
    bVar2 = ConstStridedValueAccess<1>::asBool(&local_b0);
    local_2c = (uint)bVar2;
  }
  this_00 = GeneratorState::getRandom(local_18);
  iVar3 = de::Random::getInt(this_00,local_28,local_2c);
  access.super_ConstStridedValueAccess<64>.m_value._7_1_ = iVar3 == 1;
  pVVar4 = VariableType::getScalarType(TYPE_BOOL);
  CVar6 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar4);
  local_dc = 0;
  while( true ) {
    bVar1 = access.super_ConstStridedValueAccess<64>.m_value._7_1_;
    access.super_ConstStridedValueAccess<64>.m_type = (VariableType *)CVar6.m_value;
    _auStack_d8 = CVar6.m_type;
    if (0x3f < local_dc) break;
    pbVar5 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)auStack_d8,local_dc);
    CVar6.m_value = (Scalar *)access.super_ConstStridedValueAccess<64>.m_type;
    CVar6.m_type = _auStack_d8;
    *pbVar5 = (bool)(bVar1 & 1);
    local_dc = local_dc + 1;
  }
  return;
}

Assistant:

BoolLiteral::BoolLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_BOOL))
{
	int minVal = 0;
	int maxVal = 1;

	if (valueRange.getType() == VariableType(VariableType::TYPE_BOOL, 1))
	{
		minVal = valueRange.getMin().component(0).asBool() ? 1 : 0;
		maxVal = valueRange.getMax().component(0).asBool() ? 1 : 0;
	}

	bool			value	= state.getRandom().getInt(minVal, maxVal) == 1;
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_BOOL));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asBool(ndx) = value;
}